

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

int __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
::SetAtFirstFreeSpot
          (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
           *this,RecyclerWeakReference<Js::Utf8SourceInfo> **item)

{
  int iVar1;
  
  iVar1 = Js::
          FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>,_true>
          ::GetFreeItemIndex(&this->removePolicy,this);
  if (iVar1 != -1) {
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_>::WriteBarrierSet
              ((this->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr + iVar1,*item);
    return iVar1;
  }
  iVar1 = Add(this,item);
  return iVar1;
}

Assistant:

int SetAtFirstFreeSpot(const T& item)
        {
            int indexToSetAt = removePolicy.GetFreeItemIndex(this);

            if (indexToSetAt == -1)
            {
                return Add(item);
            }

            this->buffer[indexToSetAt] = item;
            return indexToSetAt;
        }